

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O0

void __thiscall helics::BaseTimeCoordinator::disconnect(BaseTimeCoordinator *this)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  ActionMessage *pAVar3;
  long *in_RDI;
  DependencyInfo *dep_1;
  iterator __end2;
  iterator __begin2;
  TimeDependencies *__range2;
  bool hasLocal;
  ActionMessage multi;
  DependencyInfo *dep;
  ActionMessage bye;
  ActionMessage *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  byte in_stack_fffffffffffffde7;
  undefined8 in_stack_fffffffffffffdf8;
  action_t startingAction;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  byte bVar4;
  undefined4 in_stack_fffffffffffffe20;
  GlobalFederateId id;
  TimeRepresentation<count_time<9,_long>_> in_stack_fffffffffffffe28;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_1c0;
  long *local_1b8;
  byte local_1a9;
  BaseType local_ec;
  TimeRepresentation<count_time<9,_long>_> local_e8;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_e0;
  reference local_d8;
  undefined1 local_c0 [8];
  undefined4 local_b8;
  GlobalFederateId local_b0 [44];
  
  startingAction = (action_t)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  if ((*(byte *)((long)in_RDI + 0x57) & 1) != 0) {
    return;
  }
  bVar1 = TimeDependencies::empty((TimeDependencies *)0x61ed45);
  if (bVar1) {
    *(undefined1 *)((long)in_RDI + 0x57) = 1;
    return;
  }
  ActionMessage::ActionMessage
            ((ActionMessage *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
             startingAction);
  local_b8 = (undefined4)in_RDI[9];
  sVar2 = TimeDependencies::size((TimeDependencies *)0x61ed83);
  if (sVar2 != 1) {
    ActionMessage::ActionMessage
              ((ActionMessage *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
               startingAction);
    local_1a9 = 0;
    local_1b8 = in_RDI + 1;
    local_1c0._M_current =
         (DependencyInfo *)TimeDependencies::begin((TimeDependencies *)in_stack_fffffffffffffdd8);
    TimeDependencies::end((TimeDependencies *)in_stack_fffffffffffffdd8);
    while (bVar1 = __gnu_cxx::
                   operator==<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                             ((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                               *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                              (__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                               *)in_stack_fffffffffffffdd8), ((bVar1 ^ 0xffU) & 1) != 0) {
      pAVar3 = (ActionMessage *)
               __gnu_cxx::
               __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
               ::operator*(&local_1c0);
      if (((pAVar3->payload).buffer._M_elems[0xf] & 1) == 0) {
LAB_0061ef85:
        in_stack_fffffffffffffde7 = (pAVar3->payload).buffer._M_elems[0xe];
      }
      else {
        in_stack_fffffffffffffdd8 = pAVar3;
        in_stack_fffffffffffffe28 = TimeRepresentation<count_time<9,_long>_>::maxVal();
        bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                          ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffdd8,
                           (TimeRepresentation<count_time<9,_long>_> *)&stack0xfffffffffffffe28);
        in_stack_fffffffffffffde7 = 1;
        if (!bVar1) goto LAB_0061ef85;
      }
      if ((in_stack_fffffffffffffde7 & 1) != 0) {
        id.gid = (BaseType)in_RDI[9];
        bVar1 = GlobalFederateId::operator==
                          ((GlobalFederateId *)((pAVar3->payload).buffer._M_elems + 8),id);
        if (bVar1) {
          local_1a9 = 1;
        }
        else {
          local_b0[0].gid = *(BaseType *)((pAVar3->payload).buffer._M_elems + 8);
          appendMessage((ActionMessage *)in_stack_fffffffffffffe28.internalTimeCode,
                        (ActionMessage *)CONCAT44(id.gid,in_stack_fffffffffffffe20));
        }
      }
      __gnu_cxx::
      __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
      ::operator++(&local_1c0);
    }
    if ((local_1a9 & 1) != 0) {
      local_b0[0].gid = (BaseType)in_RDI[9];
      (**(code **)(*in_RDI + 0x18))(in_RDI,local_c0);
    }
    std::function<void_(const_helics::ActionMessage_&)>::operator()
              ((function<void_(const_helics::ActionMessage_&)> *)
               CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffdd8);
    ActionMessage::~ActionMessage
              ((ActionMessage *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    goto LAB_0061f077;
  }
  local_e0._M_current =
       (DependencyInfo *)TimeDependencies::begin((TimeDependencies *)in_stack_fffffffffffffdd8);
  this_00 = __gnu_cxx::
            __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
            ::operator*(&local_e0);
  local_d8 = this_00;
  if ((this_00->dependency & 1U) == 0) {
LAB_0061ee17:
    bVar4 = local_d8->dependent;
  }
  else {
    local_e8 = TimeRepresentation<count_time<9,_long>_>::maxVal();
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                      ((TimeRepresentation<count_time<9,_long>_> *)this_00,&local_e8);
    bVar4 = 1;
    if (!bVar1) goto LAB_0061ee17;
  }
  if ((bVar4 & 1) != 0) {
    local_b0[0].gid = (local_d8->fedID).gid;
    local_ec = (BaseType)in_RDI[9];
    bVar1 = GlobalFederateId::operator==(local_b0,(GlobalFederateId)local_ec);
    if (bVar1) {
      (**(code **)(*in_RDI + 0x18))(in_RDI,local_c0);
    }
    else {
      std::function<void_(const_helics::ActionMessage_&)>::operator()
                ((function<void_(const_helics::ActionMessage_&)> *)
                 CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                 in_stack_fffffffffffffdd8);
    }
  }
LAB_0061f077:
  *(undefined1 *)((long)in_RDI + 0x57) = 1;
  ActionMessage::~ActionMessage
            ((ActionMessage *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  return;
}

Assistant:

void BaseTimeCoordinator::disconnect()
{
    if (disconnected) {
        return;
    }

    if (dependencies.empty()) {
        disconnected = true;
        return;
    }
    ActionMessage bye(CMD_DISCONNECT);
    bye.source_id = mSourceId;
    if (dependencies.size() == 1) {
        auto& dep = *dependencies.begin();
        if ((dep.dependency && dep.next < Time::maxVal()) || dep.dependent) {
            bye.dest_id = dep.fedID;
            if (bye.dest_id == mSourceId) {
                processTimeMessage(bye);
            } else {
                sendMessageFunction(bye);
            }
        }

    } else {
        ActionMessage multi(CMD_MULTI_MESSAGE);
        bool hasLocal{false};
        for (const auto& dep : dependencies) {
            if ((dep.dependency && dep.next < Time::maxVal()) || dep.dependent) {
                if (dep.fedID == mSourceId) {
                    hasLocal = true;
                } else {
                    bye.dest_id = dep.fedID;
                    appendMessage(multi, bye);
                }
            }
        }
        if (hasLocal) {
            bye.dest_id = mSourceId;
            processTimeMessage(bye);
        }
        sendMessageFunction(multi);
    }
    disconnected = true;
}